

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

hugeint_t duckdb::TryCastCInternal<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::TryCast>
                    (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  hugeint_t input;
  hugeint_t hVar3;
  hugeint_t result_value;
  hugeint_t local_40;
  hugeint_t local_30 [2];
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = *(int64_t *)((long)pvVar1 + row * 0x10 + 8);
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10);
  bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input,&local_40,false);
  if (!bVar2) {
    hugeint_t::hugeint_t(local_30,0);
    local_40.lower = local_30[0].lower;
    local_40.upper = local_30[0].upper;
  }
  hVar3.upper = local_40.upper;
  hVar3.lower = local_40.lower;
  return hVar3;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}